

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

NJamSpell * __thiscall NJamSpell::WideToUTF8(NJamSpell *this,wstring *text)

{
  undefined1 local_78 [8];
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  converter;
  wstring *text_local;
  
  converter._88_8_ = text;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                     *)local_78);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::to_bytes((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
              *)this,(wide_string *)local_78);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                      *)local_78);
  return this;
}

Assistant:

std::string WideToUTF8(const std::wstring& text) {
#ifdef USE_BOOST_CONVERT
    using boost::locale::conv::utf_to_utf;
    return utf_to_utf<char>(text.c_str(), text.c_str() + text.size());
#else
    using convert_type = std::codecvt_utf8<wchar_t, 0x10ffff, std::little_endian>;
    std::wstring_convert<convert_type, wchar_t> converter;
    return converter.to_bytes(text);
#endif
}